

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O1

int cmime_part_from_string(CMimePart_T **part,char *content)

{
  char cVar1;
  int iVar2;
  char *in_RAX;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *local_38;
  char *dlb;
  
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x199,"int cmime_part_from_string(CMimePart_T **, const char *)");
  }
  if (content == (char *)0x0) {
    __assert_fail("content",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x19a,"int cmime_part_from_string(CMimePart_T **, const char *)");
  }
  local_38 = in_RAX;
  pcVar3 = _cmime_internal_determine_linebreak(content);
  if (pcVar3 == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    asprintf(&local_38,"%s%s",pcVar3,pcVar3);
    pcVar3 = strstr(content,local_38);
    if (pcVar3 != (char *)0x0) {
      cVar1 = *content;
      while (cVar1 != '\0') {
        iVar2 = strncasecmp(content,"Content-Type:",0xd);
        if (iVar2 == 0) {
          content = content + 0xe;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_type(*part,pcVar4);
          free(pcVar4);
        }
        iVar2 = strncasecmp(content,"Content-Transfer-Encoding:",0x1a);
        if (iVar2 == 0) {
          content = content + 0x1b;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_transfer_encoding(*part,pcVar4);
          free(pcVar4);
        }
        iVar2 = strncasecmp(content,"Content-Disposition:",0x14);
        if (iVar2 == 0) {
          content = content + 0x15;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_disposition(*part,pcVar4);
          free(pcVar4);
        }
        iVar2 = strncasecmp(content,"Content-ID:",0xb);
        if (iVar2 == 0) {
          content = content + 0xc;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_id(*part,pcVar4);
          free(pcVar4);
        }
        pcVar4 = local_38;
        sVar5 = strlen(local_38);
        iVar2 = strncmp(content,pcVar4,sVar5);
        if (iVar2 == 0) break;
        pcVar4 = content + 1;
        content = content + 1;
        cVar1 = *pcVar4;
      }
      sVar5 = strlen(local_38);
      content = pcVar3 + sVar5;
    }
    pcVar3 = strdup(content);
    cmime_part_set_content(*part,pcVar3);
    free(pcVar3);
    free(local_38);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cmime_part_from_string(CMimePart_T **part, const char *content) {
    char *ptemp = NULL;
    char *ptemp2 = NULL;
    char *body = NULL;
    char *lb = NULL;
    char *dlb;
    char *it = NULL;

    assert((*part));
    assert(content);
    
    lb = _cmime_internal_determine_linebreak(content);
    if (lb == NULL)
        return(-1);
    
    asprintf(&dlb,"%s%s",lb,lb);

    ptemp = strstr(content,dlb);
    if (ptemp != NULL) {
        it = (char *)content;
        while (*it != '\0') {
            if (strncasecmp(it,PART_CONTENT_TYPE_PATTERN,strlen(PART_CONTENT_TYPE_PATTERN))==0) {               
                it = it + sizeof(PART_CONTENT_TYPE_PATTERN);
                ptemp2 = _parse_header(it);         
                cmime_part_set_content_type((*part),ptemp2);
                free(ptemp2);
            }

            if (strncasecmp(it,PART_CONTENT_TRANSFER_ENCODING_PATTERN,strlen(PART_CONTENT_TRANSFER_ENCODING_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_TRANSFER_ENCODING_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_transfer_encoding((*part),ptemp2);
                free(ptemp2);
            }
            
            if (strncasecmp(it,PART_CONTENT_DISPOSITION_PATTERN,strlen(PART_CONTENT_DISPOSITION_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_DISPOSITION_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_disposition((*part),ptemp2);
                free(ptemp2);
            }   
                
            if (strncasecmp(it,PART_CONTENT_ID_PATTERN,strlen(PART_CONTENT_ID_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_ID_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_id((*part),ptemp2);
                free(ptemp2);
            }   

            // break if body begins 
            if (strncmp(it,dlb,strlen(dlb))==0)
                break;
                
            it++;
        }
        
        ptemp += strlen(dlb);
        body = strdup(ptemp);
    } else {
        body = strdup(content);
    }
    
    cmime_part_set_content((*part),body);
    free(body);
    free(dlb);
    
    return(0);
}